

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteSFixed32
               (int field_number,int32_t value,CodedOutputStream *output)

{
  bool bVar1;
  byte *ptr;
  uint uVar2;
  byte *ptr_00;
  uint uVar3;
  
  uVar3 = field_number << 3;
  ptr = output->cur_;
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *ptr = (byte)uVar3 | 5;
  if (uVar3 < 0x80) {
    ptr_00 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar3 | 0x85;
    ptr[1] = (byte)(uVar3 >> 7);
    ptr_00 = ptr + 2;
    if (0x3fff < uVar3) {
      uVar2 = (uint)ptr[1];
      uVar3 = uVar3 >> 7;
      do {
        ptr_00[-1] = (byte)uVar2 | 0x80;
        uVar2 = uVar3 >> 7;
        *ptr_00 = (byte)uVar2;
        ptr_00 = ptr_00 + 1;
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar2;
      } while (bVar1);
    }
  }
  output->cur_ = ptr_00;
  if ((output->impl_).end_ <= ptr_00) {
    ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr_00);
  }
  *(int32_t *)ptr_00 = value;
  output->cur_ = ptr_00 + 4;
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32(int field_number, int32_t value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteSFixed32NoTag(value, output);
}